

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cimgui.cpp
# Opt level: O0

void ImVector_ImWchar_push_back(ImVector_ImWchar *self,ImWchar v)

{
  ImWchar local_12;
  ImVector_ImWchar *pIStack_10;
  ImWchar v_local;
  ImVector_ImWchar *self_local;
  
  local_12 = v;
  pIStack_10 = self;
  ImVector<unsigned_short>::push_back(self,&local_12);
  return;
}

Assistant:

CIMGUI_API void ImVector_ImWchar_push_back(ImVector_ImWchar* self,const ImWchar v)
{
    return self->push_back(v);
}